

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O3

bool __thiscall ON_Plane::ClosestPointTo(ON_Plane *this,ON_3dPoint p,double *s,double *t)

{
  double dVar1;
  ON_3dVector local_30;
  
  ON_3dPoint::operator-(&local_30,&p,&this->origin);
  if (s != (double *)0x0) {
    dVar1 = ON_3dVector::operator*(&local_30,&this->xaxis);
    *s = dVar1;
  }
  if (t != (double *)0x0) {
    dVar1 = ON_3dVector::operator*(&local_30,&this->yaxis);
    *t = dVar1;
  }
  return true;
}

Assistant:

bool ON_Plane::ClosestPointTo( ON_3dPoint p, double* s, double* t ) const
{
  const ON_3dVector v = p - origin;
  if ( s )
    *s = v*xaxis;
  if ( t )
    *t = v*yaxis;
  return true;
}